

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void notValid(Parse *pParse,NameContext *pNC,char *zMsg,int validMask)

{
  char *local_30;
  char *zIn;
  int validMask_local;
  char *zMsg_local;
  NameContext *pNC_local;
  Parse *pParse_local;
  
  if (((uint)pNC->ncFlags & validMask) != 0) {
    local_30 = "partial index WHERE clauses";
    if ((pNC->ncFlags & 0x20) == 0) {
      if ((pNC->ncFlags & 4) != 0) {
        local_30 = "CHECK constraints";
      }
    }
    else {
      local_30 = "index expressions";
    }
    sqlite3ErrorMsg(pParse,"%s prohibited in %s",zMsg,local_30);
  }
  return;
}

Assistant:

static void notValid(
  Parse *pParse,       /* Leave error message here */
  NameContext *pNC,    /* The name context */
  const char *zMsg,    /* Type of error */
  int validMask        /* Set of contexts for which prohibited */
){
  assert( (validMask&~(NC_IsCheck|NC_PartIdx|NC_IdxExpr))==0 );
  if( (pNC->ncFlags & validMask)!=0 ){
    const char *zIn = "partial index WHERE clauses";
    if( pNC->ncFlags & NC_IdxExpr )      zIn = "index expressions";
#ifndef SQLITE_OMIT_CHECK
    else if( pNC->ncFlags & NC_IsCheck ) zIn = "CHECK constraints";
#endif
    sqlite3ErrorMsg(pParse, "%s prohibited in %s", zMsg, zIn);
  }
}